

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkElement.cpp
# Opt level: O0

shared_ptr<iDynTree::XMLElement> __thiscall
iDynTree::LinkElement::childElementForName(LinkElement *this,string *name)

{
  bool bVar1;
  shared_ptr<iDynTree::XMLElement> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  element_type *in_RDI;
  shared_ptr<iDynTree::XMLElement> sVar3;
  shared_ptr<iDynTree::InertialElement> *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  XMLParserState *in_stack_ffffffffffffffb8;
  char (*in_stack_ffffffffffffffc0) [10];
  XMLParserState *in_stack_ffffffffffffffc8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  bVar1 = std::operator==(in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
  if (bVar1) {
    iDynTree::XMLElement::getParserState();
    std::make_shared<iDynTree::InertialElement,iDynTree::XMLParserState&,iDynTree::Link&>
              (in_stack_ffffffffffffffb8,(Link *)in_RSI);
    std::shared_ptr<iDynTree::XMLElement>::shared_ptr<iDynTree::InertialElement,void>
              ((shared_ptr<iDynTree::XMLElement> *)in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff88);
    std::shared_ptr<iDynTree::InertialElement>::~shared_ptr
              ((shared_ptr<iDynTree::InertialElement> *)0x1a6aca);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    bVar1 = std::operator==(in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
    if (bVar1) {
      iDynTree::XMLElement::getParserState();
      iDynTree::Model::getPackageDirs_abi_cxx11_();
      std::
      make_shared<iDynTree::VisualElement,iDynTree::XMLParserState&,char_const(&)[7],std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
                (in_stack_ffffffffffffffc8,(char (*) [7])in_stack_ffffffffffffffc0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffffb8);
      std::shared_ptr<iDynTree::XMLElement>::shared_ptr<iDynTree::VisualElement,void>
                ((shared_ptr<iDynTree::XMLElement> *)in_stack_ffffffffffffff90,
                 (shared_ptr<iDynTree::VisualElement> *)in_stack_ffffffffffffff88);
      std::shared_ptr<iDynTree::VisualElement>::~shared_ptr
                ((shared_ptr<iDynTree::VisualElement> *)0x1a6b38);
      _Var2._M_pi = extraout_RDX_00;
    }
    else {
      bVar1 = std::operator==(in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
      if (bVar1) {
        this_00 = (shared_ptr<iDynTree::XMLElement> *)iDynTree::XMLElement::getParserState();
        iDynTree::Model::getPackageDirs_abi_cxx11_();
        std::
        make_shared<iDynTree::VisualElement,iDynTree::XMLParserState&,char_const(&)[10],std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
                  (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffffb8);
        std::shared_ptr<iDynTree::XMLElement>::shared_ptr<iDynTree::VisualElement,void>
                  (this_00,(shared_ptr<iDynTree::VisualElement> *)in_stack_ffffffffffffff88);
        std::shared_ptr<iDynTree::VisualElement>::~shared_ptr
                  ((shared_ptr<iDynTree::VisualElement> *)0x1a6ba6);
        _Var2._M_pi = extraout_RDX_01;
      }
      else {
        iDynTree::XMLElement::getParserState();
        sVar3 = std::
                make_shared<iDynTree::XMLElement,iDynTree::XMLParserState&,std::__cxx11::string_const&>
                          (in_stack_ffffffffffffffb8,in_RSI);
        _Var2 = sVar3.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      }
    }
  }
  sVar3.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<iDynTree::XMLElement>)
         sVar3.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<iDynTree::XMLElement> LinkElement::childElementForName(const std::string& name) {
        if (name == "inertial") {
            return std::make_shared<InertialElement>(getParserState(), m_link);
        } else if (name == "visual") {
            return std::make_shared<VisualElement>(getParserState(), "visual", m_model.getPackageDirs());
        } else if (name == "collision") {
            return std::make_shared<VisualElement>(getParserState(), "collision", m_model.getPackageDirs());
        }
        return std::make_shared<iDynTree::XMLElement>(getParserState(), name);
    }